

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O2

void __thiscall KDReports::ReportBuilder::addVariable(ReportBuilder *this,VariableType variable)

{
  MoveMode pos;
  QTextCursor *pQVar1;
  QTextCursor docCursor;
  QString value;
  QTextCharFormat origCharFormat;
  TextElement element;
  QTextCursor aQStack_78 [8];
  QArrayDataPointer<char16_t> local_70;
  QTextFormat local_58 [16];
  QTextFormat local_48 [16];
  QArrayDataPointer<char16_t> local_38;
  
  pQVar1 = cursor(this);
  pos = QTextCursor::position();
  if (variable == PageCount) {
    local_70.d = (Data *)0x0;
    local_70.ptr = L"UNKNOWN YET";
    local_70.size = 0xb;
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  else {
    variableValue((QString *)&local_70,0,this->m_report,variable);
  }
  TextElement::TextElement((TextElement *)&local_38,(QString *)&local_70);
  QTextCursor::charFormat();
  QTextCursor::QTextCursor(aQStack_78,&this->m_contentDocument->m_document);
  QTextCursor::setPosition((int)aQStack_78,pos);
  QTextCursor::charFormat();
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  QTextFormat::~QTextFormat(local_58);
  QTextCursor::beginEditBlock();
  TextElement::build((TextElement *)&local_38,this);
  QTextCursor::endEditBlock();
  setVariableMarker(&this->m_contentDocument->m_document,pos,variable,(int)local_70.size);
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  QTextCursor::~QTextCursor(aQStack_78);
  QTextFormat::~QTextFormat(local_48);
  TextElement::~TextElement((TextElement *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  return;
}

Assistant:

void KDReports::ReportBuilder::addVariable(KDReports::VariableType variable)
{
    QTextCursor &cursor = this->cursor();
    const int charPosition = cursor.position();
    // Don't ask for the value of PageCount yet -- it would create a documentlayout
    // which would make any later insertion into the textdocument much, much slower.
    const QString value = variable == KDReports::PageCount ? QStringLiteral("UNKNOWN YET") : variableValue(0 /*pageNumber*/, m_report, variable);
    KDReports::TextElement element(value);

    const QTextCharFormat origCharFormat = cursor.charFormat();

    // Keep the current font (KDRE-91).
    QTextCursor docCursor(&currentDocument());
    docCursor.setPosition(charPosition);
    cursor.setCharFormat(docCursor.charFormat());

    cursor.beginEditBlock();
    element.build(*this);
    cursor.endEditBlock();

    setVariableMarker(currentDocument(), charPosition, variable, value.length());

    cursor.setCharFormat(origCharFormat); // restore the orig format
}